

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O0

void __thiscall amrex::ClusterList::boxArray(ClusterList *this,BoxArray *ba)

{
  bool bVar1;
  reference ppCVar2;
  undefined8 in_RSI;
  BoxArray *in_RDI;
  const_iterator End;
  const_iterator cli;
  int i;
  list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  _Self local_28;
  _Self local_20;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  
  BoxArray::clear((BoxArray *)End._M_node);
  std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::size
            ((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  BoxArray::resize((BoxArray *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (Long)in_stack_ffffffffffffffb8);
  iVar3 = 0;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::begin
                 (in_stack_ffffffffffffffb8);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::end
                 (in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppCVar2 = std::_List_const_iterator<amrex::Cluster_*>::operator*
                        ((_List_const_iterator<amrex::Cluster_*> *)
                         CONCAT44(iVar3,in_stack_ffffffffffffffc0));
    Cluster::box(*ppCVar2);
    BoxArray::set(in_RDI,(int)((ulong)in_RSI >> 0x20),
                  (Box *)CONCAT44(iVar3,in_stack_ffffffffffffffe8));
    std::_List_const_iterator<amrex::Cluster_*>::operator++(&local_20);
    iVar3 = iVar3 + 1;
  }
  return;
}

Assistant:

void
ClusterList::boxArray (BoxArray& ba) const
{
    ba.clear();

    ba.resize(lst.size());

    int i = 0;

    for (std::list<Cluster*>::const_iterator cli = lst.begin(), End = lst.end();
         cli != End;
         ++cli, ++i)
    {
        ba.set(i,(*cli)->box());
    }
}